

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O3

void __thiscall
stackjit::AssemblyImageGenerator::generateClassBody
          (AssemblyImageGenerator *this,BinaryData *data,Class *classDef)

{
  pointer pFVar1;
  string *psVar2;
  AttributeContainer *pAVar3;
  vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_> *pvVar4;
  Class *this_00;
  Field *this_01;
  Field *field;
  pointer this_02;
  
  psVar2 = Loader::Class::parentClassName_abi_cxx11_(classDef);
  anon_unknown_3::addString(data,psVar2);
  this_00 = classDef;
  pAVar3 = Loader::Class::attributes_abi_cxx11_(classDef);
  generateAttributes((AssemblyImageGenerator *)this_00,data,pAVar3);
  pvVar4 = Loader::Class::fields(classDef);
  anon_unknown_3::addData<unsigned_long>
            (data,((long)(pvVar4->
                         super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar4->
                         super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111);
  pvVar4 = Loader::Class::fields(classDef);
  pFVar1 = (pvVar4->
           super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (pvVar4->
                 super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>
                 )._M_impl.super__Vector_impl_data._M_start; this_02 != pFVar1;
      this_02 = this_02 + 1) {
    this_01 = this_02;
    pAVar3 = Loader::Field::attributes_abi_cxx11_(this_02);
    generateAttributes((AssemblyImageGenerator *)this_01,data,pAVar3);
    psVar2 = Loader::Field::name_abi_cxx11_(this_02);
    anon_unknown_3::addString(data,psVar2);
    psVar2 = Loader::Field::type_abi_cxx11_(this_02);
    anon_unknown_3::addString(data,psVar2);
  }
  return;
}

Assistant:

void AssemblyImageGenerator::generateClassBody(BinaryData& data, Loader::Class& classDef) {
		//Inheritance
		addString(data, classDef.parentClassName());

		//Class attributes
		generateAttributes(data, classDef.attributes());

		//Fields
		addData(data, classDef.fields().size());
		for (auto& field : classDef.fields()) {
			generateAttributes(data, field.attributes());
			addString(data, field.name());
			addString(data, field.type());
		}
	}